

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dual_Resampler.cpp
# Opt level: O2

void __thiscall
Dual_Resampler::dual_play(Dual_Resampler *this,long count,dsample_t *out,Blip_Buffer *blip_buf)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  
  uVar1 = this->sample_buf_size;
  uVar3 = (ulong)uVar1;
  uVar2 = this->buf_pos;
  if (uVar1 != uVar2) {
    lVar4 = (long)(int)(uVar1 - uVar2);
    if (count <= (int)(uVar1 - uVar2)) {
      lVar4 = count;
    }
    count = count - lVar4;
    memcpy(out,(this->sample_buf).begin_ + (int)uVar2,lVar4 * 2);
    out = out + lVar4;
    this->buf_pos = this->buf_pos + (int)lVar4;
    uVar3 = (ulong)(uint)this->sample_buf_size;
  }
  for (; (int)uVar3 <= count; count = count - uVar3) {
    play_frame_(this,blip_buf,out);
    uVar3 = (ulong)this->sample_buf_size;
    out = out + uVar3;
  }
  if (count != 0) {
    play_frame_(this,blip_buf,(this->sample_buf).begin_);
    this->buf_pos = (int)count;
    memcpy(out,(this->sample_buf).begin_,count * 2);
    return;
  }
  return;
}

Assistant:

void Dual_Resampler::dual_play( long count, dsample_t* out, Blip_Buffer& blip_buf )
{
	// empty extra buffer
	long remain = sample_buf_size - buf_pos;
	if ( remain )
	{
		if ( remain > count )
			remain = count;
		count -= remain;
		memcpy( out, &sample_buf [buf_pos], remain * sizeof *out );
		out += remain;
		buf_pos += remain;
	}
	
	// entire frames
	while ( count >= (long) sample_buf_size )
	{
		play_frame_( blip_buf, out );
		out += sample_buf_size;
		count -= sample_buf_size;
	}
	
	// extra
	if ( count )
	{
		play_frame_( blip_buf, sample_buf.begin() );
		buf_pos = count;
		memcpy( out, sample_buf.begin(), count * sizeof *out );
		out += count;
	}
}